

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

test_suite * init_unit_test_suite(int param_1,char **param_2)

{
  test_suite *ptVar1;
  void *pvVar2;
  size_t in_stack_00000038;
  const_string *in_stack_00000040;
  const_string *in_stack_00000048;
  test_suite *test;
  BufferTestSuite *in_stack_000005b0;
  test_suite *expected_failures;
  test_unit *in_stack_ffffffffffffffb8;
  test_suite *in_stack_ffffffffffffffc0;
  uint timeout;
  
  ptVar1 = (test_suite *)operator_new(0x180);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffffc0,
             (pointer)in_stack_ffffffffffffffb8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffffc0,
             (pointer)in_stack_ffffffffffffffb8);
  boost::unit_test::test_suite::test_suite
            (test,in_stack_00000048,in_stack_00000040,in_stack_00000038);
  expected_failures = ptVar1;
  pvVar2 = operator_new(0x180);
  timeout = (uint)((ulong)pvVar2 >> 0x20);
  BufferTestSuite::BufferTestSuite(in_stack_000005b0);
  boost::unit_test::test_suite::add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(counter_t)expected_failures,
             timeout);
  return ptVar1;
}

Assistant:

boost::unit_test::test_suite*
init_unit_test_suite( int, char* [] ) 
{
    boost::unit_test::test_suite *test (BOOST_TEST_SUITE ("Buffer Unit Tests"));
    test->add (new BufferTestSuite() );

    return test;
}